

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

void __thiscall
fast_float::stackvec<(unsigned_short)62>::resize_unchecked
          (stackvec<(unsigned_short)62> *this,size_t new_len,limb value)

{
  limb lVar1;
  size_t sVar2;
  size_t sVar3;
  limb *last;
  limb *first;
  size_t count;
  limb value_local;
  size_t new_len_local;
  stackvec<(unsigned_short)62> *this_local;
  
  count = value;
  value_local = new_len;
  new_len_local = (size_t)this;
  sVar2 = len(this);
  lVar1 = value_local;
  if (sVar2 < new_len) {
    sVar2 = len(this);
    sVar3 = len(this);
    std::fill<unsigned_long*,unsigned_long>
              (this->data + sVar3,this->data + sVar3 + (lVar1 - sVar2),&count);
    set_len(this,value_local);
  }
  else {
    set_len(this,value_local);
  }
  return;
}

Assistant:

FASTFLOAT_CONSTEXPR20
  void resize_unchecked(size_t new_len, limb value) noexcept {
    if (new_len > len()) {
      size_t count = new_len - len();
      limb* first = data + len();
      limb* last = first + count;
      ::std::fill(first, last, value);
      set_len(new_len);
    } else {
      set_len(new_len);
    }
  }